

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# throwable.cc
# Opt level: O2

t_pvalue __thiscall
xemmai::t_type_of<xemmai::t_throwable>::f_do_construct
          (t_type_of<xemmai::t_throwable> *this,t_pvalue *a_stack,size_t a_n)

{
  t_object *ptVar1;
  size_t in_RCX;
  anon_union_8_2_8dc3d723_for_t_value<xemmai::t_pointer>_2 extraout_RDX;
  t_pvalue tVar2;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> local_28;
  
  t_signature<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_&&>::f_check(in_RCX);
  t_signature<std::basic_string_view<wchar_t,std::char_traits<wchar_t>>&&>::f_check<0ul>(a_n + 0x20)
  ;
  local_28._M_len = *(size_t *)(*(long *)(a_n + 0x20) + 0x48);
  local_28._M_str = (wchar_t *)(*(long *)(a_n + 0x20) + 0x50);
  ptVar1 = t_type_of<xemmai::t_object>::
           f_new<xemmai::t_throwable,std::basic_string_view<wchar_t,std::char_traits<wchar_t>>>
                     ((t_type_of<xemmai::t_object> *)a_stack,&local_28);
  (this->
  super_t_derivable<xemmai::t_holds<xemmai::t_throwable,_xemmai::t_type_of<xemmai::t_object>_>,_xemmai::t_derived<xemmai::t_type_of<xemmai::t_throwable>_>_>
  ).super_t_holds<xemmai::t_throwable,_xemmai::t_type_of<xemmai::t_object>_>.
  super_t_finalizes<xemmai::t_bears<xemmai::t_throwable,_xemmai::t_type_of<xemmai::t_object>_>_>.
  super_t_bears<xemmai::t_throwable,_xemmai::t_type_of<xemmai::t_object>_>.
  super_t_derives<xemmai::t_throwable,_xemmai::t_type_of<xemmai::t_object>_>.
  super_t_type_of<xemmai::t_object>.v_this = (t_slot)ptVar1;
  tVar2.field_0.v_integer = extraout_RDX.v_integer;
  tVar2.super_t_pointer.v_p = (t_object *)this;
  return tVar2;
}

Assistant:

t_pvalue t_type_of<t_throwable>::f_do_construct(t_pvalue* a_stack, size_t a_n)
{
	return t_construct<std::wstring_view>::t_bind<t_throwable>::f_do(this, a_stack, a_n);
}